

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testIsEmpty<Imath_2_5::Vec4<int>>(char *type)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ostream *poVar5;
  int *piVar6;
  char *in_RDI;
  Box<Imath_2_5::Vec4<int>_> b_1;
  Vec4<int> max;
  Vec4<int> min;
  Box<Imath_2_5::Vec4<int>_> b1;
  uint i;
  Vec4<int> p1;
  Vec4<int> p0;
  Box<Imath_2_5::Vec4<int>_> b0;
  Box<Imath_2_5::Vec4<int>_> b;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  Box<Imath_2_5::Vec4<int>_> *in_stack_ffffffffffffff18;
  Box<Imath_2_5::Vec4<int>_> *in_stack_ffffffffffffff20;
  Vec4<int> local_cc;
  Vec4<int> local_bc [3];
  uint local_8c;
  Vec4<int> local_88;
  Vec4<int> local_78;
  Vec4<int> local_68;
  Vec4<int> local_58 [5];
  char *local_8;
  
  local_8 = in_RDI;
  poVar5 = std::operator<<((ostream *)&std::cout,"    isEmpty() for type ");
  poVar5 = std::operator<<(poVar5,local_8);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  Imath_2_5::Box<Imath_2_5::Vec4<int>_>::Box
            ((Box<Imath_2_5::Vec4<int>_> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  bVar2 = Imath_2_5::Box<Imath_2_5::Vec4<int>_>::isEmpty(in_stack_ffffffffffffff18);
  if (!bVar2) {
    __assert_fail("b.isEmpty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x2e8,
                  "void (anonymous namespace)::testIsEmpty(const char *) [T = Imath_2_5::Vec4<int>]"
                 );
  }
  Imath_2_5::Vec4<int>::Vec4(local_58,-1);
  Imath_2_5::Vec4<int>::Vec4(&local_68,1);
  Imath_2_5::Box<Imath_2_5::Vec4<int>_>::Box
            (in_stack_ffffffffffffff20,&in_stack_ffffffffffffff18->min,
             (Vec4<int> *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  bVar2 = Imath_2_5::Box<Imath_2_5::Vec4<int>_>::isEmpty(in_stack_ffffffffffffff18);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b0.isEmpty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x2f3,
                  "void (anonymous namespace)::testIsEmpty(const char *) [T = Imath_2_5::Vec4<int>]"
                 );
  }
  Imath_2_5::Vec4<int>::Vec4(&local_78);
  Imath_2_5::Vec4<int>::Vec4(&local_88);
  local_8c = 0;
  while( true ) {
    uVar4 = local_8c;
    uVar3 = Imath_2_5::Vec4<int>::dimensions();
    if (uVar3 <= uVar4) break;
    cVar1 = (char)local_8c;
    piVar6 = Imath_2_5::Vec4<int>::operator[](&local_78,local_8c);
    *piVar6 = -(1 << (cVar1 + 1U & 0x1f));
    uVar4 = Imath_2_5::Vec4<int>::dimensions();
    cVar1 = (char)local_8c;
    piVar6 = Imath_2_5::Vec4<int>::operator[](&local_88,local_8c);
    *piVar6 = 1 << ((char)uVar4 - cVar1 & 0x1fU);
    local_8c = local_8c + 1;
  }
  Imath_2_5::Box<Imath_2_5::Vec4<int>_>::Box
            (in_stack_ffffffffffffff20,&in_stack_ffffffffffffff18->min,
             (Vec4<int> *)CONCAT44(in_stack_ffffffffffffff14,uVar4));
  bVar2 = Imath_2_5::Box<Imath_2_5::Vec4<int>_>::isEmpty(in_stack_ffffffffffffff18);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b1.isEmpty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x2fd,
                  "void (anonymous namespace)::testIsEmpty(const char *) [T = Imath_2_5::Vec4<int>]"
                 );
  }
  Imath_2_5::Vec4<int>::Vec4(local_bc,0);
  Imath_2_5::Vec4<int>::Vec4(&local_cc,local_bc);
  uVar3 = Imath_2_5::Vec4<int>::dimensions();
  piVar6 = Imath_2_5::Vec4<int>::operator[](&local_cc,uVar3 - 1);
  *piVar6 = 2;
  Imath_2_5::Box<Imath_2_5::Vec4<int>_>::Box
            (in_stack_ffffffffffffff20,&in_stack_ffffffffffffff18->min,
             (Vec4<int> *)CONCAT44(in_stack_ffffffffffffff14,uVar4));
  bVar2 = Imath_2_5::Box<Imath_2_5::Vec4<int>_>::isEmpty(in_stack_ffffffffffffff18);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b.isEmpty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x30e,
                  "void (anonymous namespace)::testIsEmpty(const char *) [T = Imath_2_5::Vec4<int>]"
                 );
  }
  return;
}

Assistant:

void
testIsEmpty(const char *type)
{
    cout << "    isEmpty() for type " << type << endl;

    //
    // Empty box.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        assert(b.isEmpty());
    }

    //
    // Non-empty, has-volume box.
    //    2D: [(-2, -4),         ( 8,  2)       ]
    //    3D: [(-2, -4, -6),     (12,  8, 2)    ]
    //    4D: [(-2, -4, -6, -8), (16, 12, 8, 4) ]
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b0(T(-1), T(1));
        assert(!b0.isEmpty());

        T p0;
        T p1;
        for (unsigned int i = 0; i < T::dimensions(); i++)
        {
           p0[i] = -typename T::BaseType(1 << (i + 1));
           p1[i] =  typename T::BaseType(1 << (T::dimensions() - i));
        }
        IMATH_INTERNAL_NAMESPACE::Box<T> b1(p0, p1);
        assert(!b1.isEmpty());
    }

    //
    // Non-empty, no-volume box.
    // Boxes are:
    //    2D: [(0, 0),       (0, 2)      ]
    //    3D: [(0, 0, 0),    (0, 0, 2)   ]
    //    4D: [(0, 0, 0, 0), (0, 0, 0, 2)]
    //
    {
        T min(0);
        T max = min;
        max[T::dimensions() - 1] = 2;

        IMATH_INTERNAL_NAMESPACE::Box<T> b(min, max);

        assert(!b.isEmpty());
    }
}